

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_set_quality(void *_r,int quality)

{
  uint in_ESI;
  long in_RDI;
  resampler *r;
  undefined4 local_c;
  
  if ((int)in_ESI < 0) {
    local_c = 0;
  }
  else {
    local_c = in_ESI;
    if (5 < (int)in_ESI) {
      local_c = 5;
    }
  }
  if (*(byte *)(in_RDI + 0x30) != local_c) {
    if ((((local_c == 1) || (*(char *)(in_RDI + 0x30) == '\x01')) || (local_c == 3)) ||
       (*(char *)(in_RDI + 0x30) == '\x03')) {
      *(undefined4 *)(in_RDI + 8) = 0;
      *(undefined4 *)(in_RDI + 0xc) = 0;
      *(undefined8 *)(in_RDI + 0x38) = 0;
      *(undefined8 *)(in_RDI + 0x40) = 0;
      memset((void *)(in_RDI + 0x248),0,0x17c);
    }
    *(undefined1 *)(in_RDI + 0x31) = 0xff;
    *(undefined1 *)(in_RDI + 0x32) = 0xff;
  }
  *(char *)(in_RDI + 0x30) = (char)local_c;
  return;
}

Assistant:

void resampler_set_quality(void *_r, int quality)
{
    resampler * r = ( resampler * ) _r;
    if (quality < RESAMPLER_QUALITY_MIN)
        quality = RESAMPLER_QUALITY_MIN;
    else if (quality > RESAMPLER_QUALITY_MAX)
        quality = RESAMPLER_QUALITY_MAX;
    if ( r->quality != quality )
    {
        if ( quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLEP ||
             quality == RESAMPLER_QUALITY_BLAM || r->quality == RESAMPLER_QUALITY_BLAM )
        {
            r->read_pos = 0;
            r->read_filled = 0;
            r->last_amp = 0;
            r->accumulator = 0;
            memset( r->buffer_out, 0, sizeof(r->buffer_out) );
        }
        r->delay_added = -1;
        r->delay_removed = -1;
    }
    r->quality = (unsigned char)quality;
}